

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O2

void Ssw_StrSimMatchingExtendOne(Aig_Man_t *p,Vec_Ptr_t *vNodes)

{
  uint uVar1;
  int iVar2;
  int iFan;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t **ppAVar4;
  int i;
  void *pvVar5;
  
  vNodes->nSize = 0;
  Aig_ManIncrementTravId(p);
  iFan = -1;
  i = 0;
  do {
    if (p->vObjs->nSize <= i) {
      return;
    }
    pObj = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,i);
    if (((pObj != (Aig_Obj_t *)0x0) &&
        ((uVar1 = *(uint *)&pObj->field_0x18 & 7, uVar1 == 2 || (uVar1 - 5 < 2)))) &&
       ((p->pReprs == (Aig_Obj_t **)0x0 || (p->pReprs[pObj->Id] == (Aig_Obj_t *)0x0)))) {
      iVar2 = Saig_ObjIsLo(p,pObj);
      if (iVar2 != 0) {
        pAVar3 = Saig_ObjLoToLi(p,pObj);
        if ((((p->pReprs != (Aig_Obj_t **)0x0) &&
             (pvVar5 = (void *)((ulong)pAVar3->pFanin0 & 0xfffffffffffffffe),
             p->pReprs[*(int *)((long)pvVar5 + 0x24)] != (Aig_Obj_t *)0x0)) &&
            (*(int *)((long)pvVar5 + 0x20) != p->nTravIds)) &&
           ((*(uint *)((long)pvVar5 + 0x18) & 7) != 1)) {
          *(int *)((long)pvVar5 + 0x20) = p->nTravIds;
          Vec_PtrPush(vNodes,pvVar5);
        }
      }
      if ((0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7) &&
         (ppAVar4 = p->pReprs, ppAVar4 != (Aig_Obj_t **)0x0)) {
        pvVar5 = (void *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
        if ((ppAVar4[*(int *)((long)pvVar5 + 0x24)] != (Aig_Obj_t *)0x0) &&
           (*(int *)((long)pvVar5 + 0x20) != p->nTravIds)) {
          *(int *)((long)pvVar5 + 0x20) = p->nTravIds;
          Vec_PtrPush(vNodes,pvVar5);
          ppAVar4 = p->pReprs;
          if (ppAVar4 == (Aig_Obj_t **)0x0) goto LAB_0059cb77;
        }
        pvVar5 = (void *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
        if ((ppAVar4[*(int *)((long)pvVar5 + 0x24)] != (Aig_Obj_t *)0x0) &&
           (*(int *)((long)pvVar5 + 0x20) != p->nTravIds)) {
          *(int *)((long)pvVar5 + 0x20) = p->nTravIds;
          Vec_PtrPush(vNodes,pvVar5);
        }
      }
LAB_0059cb77:
      if (p->pFanData == (int *)0x0) {
        __assert_fail("p->pFanData",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigStrSim.c"
                      ,0x2f4,"void Ssw_StrSimMatchingExtendOne(Aig_Man_t *, Vec_Ptr_t *)");
      }
      for (uVar1 = 0; uVar1 < *(uint *)&pObj->field_0x18 >> 6; uVar1 = uVar1 + 1) {
        if (uVar1 == 0) {
          iFan = Aig_ObjFanout0Int(p,pObj->Id);
        }
        else {
          iFan = Aig_ObjFanoutNext(p,iFan);
        }
        pAVar3 = Aig_ManObj(p,iFan >> 1);
        iVar2 = Saig_ObjIsPo(p,pAVar3);
        if (iVar2 == 0) {
          iVar2 = Saig_ObjIsLi(p,pAVar3);
          if (iVar2 != 0) {
            pAVar3 = Saig_ObjLiToLo(p,pAVar3);
          }
          if (((p->pReprs != (Aig_Obj_t **)0x0) && (p->pReprs[pAVar3->Id] != (Aig_Obj_t *)0x0)) &&
             (pAVar3->TravId != p->nTravIds)) {
            pAVar3->TravId = p->nTravIds;
            Vec_PtrPush(vNodes,pAVar3);
          }
        }
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Ssw_StrSimMatchingExtendOne( Aig_Man_t * p, Vec_Ptr_t * vNodes )
{
    Aig_Obj_t * pNext, * pObj;
    int i, k, iFan = -1;
    Vec_PtrClear( vNodes );
    Aig_ManIncrementTravId( p );
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
            continue;
        if ( Aig_ObjRepr( p, pObj ) != NULL )
            continue;
        if ( Saig_ObjIsLo(p, pObj) )
        {
            pNext = Saig_ObjLoToLi(p, pObj);
            pNext = Aig_ObjFanin0(pNext);
            if ( Aig_ObjRepr( p, pNext ) && !Aig_ObjIsTravIdCurrent(p, pNext) && !Aig_ObjIsConst1(pNext) )
            {
                Aig_ObjSetTravIdCurrent(p, pNext);
                Vec_PtrPush( vNodes, pNext );
            }
        }
        if ( Aig_ObjIsNode(pObj) )
        {
            pNext = Aig_ObjFanin0(pObj);
            if ( Aig_ObjRepr( p, pNext )&& !Aig_ObjIsTravIdCurrent(p, pNext) )
            {
                Aig_ObjSetTravIdCurrent(p, pNext);
                Vec_PtrPush( vNodes, pNext );
            }
            pNext = Aig_ObjFanin1(pObj);
            if ( Aig_ObjRepr( p, pNext ) && !Aig_ObjIsTravIdCurrent(p, pNext) )
            {
                Aig_ObjSetTravIdCurrent(p, pNext);
                Vec_PtrPush( vNodes, pNext );
            }
        }
        Aig_ObjForEachFanout( p, pObj, pNext, iFan, k )
        {
            if ( Saig_ObjIsPo(p, pNext) )
                continue;
            if ( Saig_ObjIsLi(p, pNext) )
                pNext = Saig_ObjLiToLo(p, pNext);
            if ( Aig_ObjRepr( p, pNext ) && !Aig_ObjIsTravIdCurrent(p, pNext) )
            {
                Aig_ObjSetTravIdCurrent(p, pNext);
                Vec_PtrPush( vNodes, pNext );
            }
        }
    }
}